

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O3

bool __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,weighted_vec_array *weighted_vecs,
          uint max_clusters,vector<crnlib::vector<unsigned_int>_> *cluster_indices,
          progress_callback_func pProgress_callback,void *pProgress_callback_data)

{
  vector_clusterizer *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  task_pool *this_01;
  long lVar4;
  uint *puVar5;
  uint uVar6;
  crn_thread_id_t cVar7;
  long lVar8;
  executable_task *pObj;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint i;
  uint64 data;
  long lVar12;
  vector<unsigned_int> *pvVar13;
  vector<unsigned_int> *pvVar14;
  void *pvVar15;
  uint i_1;
  uint uVar16;
  vector<unsigned_int> primary_indices;
  create_clusters_task_state task_state [4];
  vector<unsigned_int> indices [6];
  vector<unsigned_int> local_148;
  vector<unsigned_int> local_138;
  undefined1 local_128 [16];
  undefined4 local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  vector<unsigned_int> local_98;
  vector<unsigned_int> local_88;
  vector<unsigned_int> local_78;
  vector<unsigned_int> local_68;
  vector<unsigned_int> local_58;
  vector<unsigned_int> local_48;
  undefined1 auStack_38 [8];
  
  cVar7 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar7;
  this->m_canceled = false;
  this->m_pProgress_callback = pProgress_callback;
  this->m_pProgress_callback_data = pProgress_callback_data;
  if (max_clusters < 0x80) {
    this_00 = this->m_clusterizers;
    clusterizer<crnlib::vec<16U,_float>_>::clear(this_00);
    vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::reserve
              (&this_00->m_training_vecs,weighted_vecs->m_size);
    if (weighted_vecs->m_size != 0) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                  (this_00,(vec<16U,_float> *)((long)(weighted_vecs->m_p->m_vec).m_s + lVar8),
                   *(uint *)((long)(&weighted_vecs->m_p->m_vec + 1) + lVar8));
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x44;
      } while (uVar9 < weighted_vecs->m_size);
    }
    clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
              (this_00,max_clusters,generate_codebook_progress_callback,this,false);
    clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
              (this_00,this->m_clusterizers[0].m_codebook.m_size,cluster_indices);
  }
  else {
    uVar2 = weighted_vecs->m_size;
    local_148.m_p = (uint *)0x0;
    local_148.m_size = 0;
    local_148.m_capacity = 0;
    if (uVar2 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,uVar2,uVar2 == 1,4,(object_mover)0x0,false);
      memset(local_148.m_p + local_148.m_size,0,(ulong)(uVar2 - local_148.m_size) << 2);
      local_148.m_size = uVar2;
      if (weighted_vecs->m_size != 0) {
        uVar9 = 0;
        do {
          local_148.m_p[uVar9] = (uint)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar9 < weighted_vecs->m_size);
      }
    }
    local_48.m_p = (uint *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_58.m_p = (uint *)0x0;
    local_58.m_size = 0;
    local_58.m_capacity = 0;
    local_68.m_p = (uint *)0x0;
    local_68.m_size = 0;
    local_68.m_capacity = 0;
    local_78.m_p = (uint *)0x0;
    local_78.m_size = 0;
    local_78.m_capacity = 0;
    local_88.m_p = (uint *)0x0;
    local_88.m_size = 0;
    local_88.m_capacity = 0;
    local_98.m_p = (uint *)0x0;
    local_98.m_size = 0;
    local_98.m_capacity = 0;
    compute_split(this,weighted_vecs,&local_148,&local_98,&local_88);
    compute_split(this,weighted_vecs,&local_98,&local_78,&local_68);
    compute_split(this,weighted_vecs,&local_88,&local_58,&local_48);
    uVar16 = 0;
    local_118 = 0;
    local_128 = (undefined1  [16])0x0;
    local_138.m_p = (uint *)0x0;
    local_138.m_size = 0;
    local_138.m_capacity = 0;
    local_110 = (undefined1  [16])0x0;
    local_100 = (undefined1  [16])0x0;
    local_f0 = 0;
    local_e8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    local_c8 = 0;
    local_c0 = (undefined1  [16])0x0;
    local_b0 = (undefined1  [16])0x0;
    local_a0 = 0;
    this->m_cluster_task_displayed_progress = false;
    lVar8 = 0x28;
    do {
      uVar16 = (uVar16 + 1) - (uint)(*(int *)((long)&local_98.m_p + lVar8) == 0);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x68);
    pvVar13 = &local_98;
    pvVar14 = &local_138;
    lVar8 = -0x40;
    data = 0;
    do {
      if (*(int *)(&stack0xffffffffffffffd0 + lVar8) != 0) {
        pvVar14->m_p = (uint *)weighted_vecs;
        *(undefined1 **)&pvVar14->m_size = auStack_38 + lVar8;
        *(uint *)&pvVar14[2].m_p = ((uVar16 >> 1) + max_clusters) / uVar16;
        this_01 = this->m_pTask_pool;
        pObj = (executable_task *)crnlib_malloc(0x28);
        pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d24f8;
        pObj[1]._vptr_executable_task = (_func_int **)this;
        pObj[2]._vptr_executable_task = (_func_int **)create_clusters_task;
        pObj[3]._vptr_executable_task = (_func_int **)0x0;
        *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
        task_pool::queue_task(this_01,pObj,data,pvVar14);
      }
      data = data + 1;
      pvVar14 = (vector<unsigned_int> *)&pvVar14[2].m_size;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0);
    task_pool::join(this->m_pTask_pool);
    bVar1 = this->m_canceled;
    if (bVar1 != true) {
      vector<crnlib::vector<unsigned_int>_>::reserve
                (cluster_indices,local_b0._8_4_ + local_100._8_4_ + local_d8._8_4_ + local_128._8_4_
                );
      uVar16 = cluster_indices->m_size;
      if ((ulong)uVar16 != 0) {
        pvVar14 = cluster_indices->m_p;
        lVar8 = 0;
        do {
          pvVar15 = *(void **)((long)&pvVar14->m_p + lVar8);
          if (pvVar15 != (void *)0x0) {
            crnlib_free(pvVar15);
          }
          lVar8 = lVar8 + 0x10;
        } while ((ulong)uVar16 << 4 != lVar8);
        cluster_indices->m_size = 0;
      }
      lVar8 = 0;
      do {
        iVar3 = *(int *)(local_128 + lVar8 * 0x28 + 8);
        if (iVar3 != 0) {
          uVar16 = cluster_indices->m_size;
          uVar11 = iVar3 + uVar16;
          if (uVar11 < uVar16) {
            pvVar14 = cluster_indices->m_p;
            lVar12 = 0;
            do {
              pvVar15 = *(void **)((long)&pvVar14[uVar11].m_p + lVar12);
              if (pvVar15 != (void *)0x0) {
                crnlib_free(pvVar15);
              }
              lVar12 = lVar12 + 0x10;
            } while ((ulong)(uint)-iVar3 << 4 != lVar12);
          }
          else {
            uVar6 = uVar16;
            if (cluster_indices->m_capacity < uVar11) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)cluster_indices,uVar11,iVar3 == 1,0x10,
                         (object_mover)0x0,false);
              uVar6 = cluster_indices->m_size;
            }
            if (uVar11 - uVar6 != 0) {
              memset(cluster_indices->m_p + uVar6,0,(ulong)(uVar11 - uVar6) << 4);
            }
          }
          lVar12 = lVar8 * 0x28;
          cluster_indices->m_size = uVar11;
          if (*(int *)(local_128 + lVar12 + 8) != 0) {
            lVar10 = 0xc;
            uVar9 = 0;
            do {
              uVar11 = (int)uVar9 + uVar16;
              pvVar14 = cluster_indices->m_p;
              lVar4 = *(long *)(local_128 + lVar12);
              puVar5 = pvVar14[uVar11].m_p;
              pvVar14[uVar11].m_p = *(uint **)(lVar4 + -0xc + lVar10);
              *(uint **)(lVar4 + -0xc + lVar10) = puVar5;
              uVar2 = pvVar14[uVar11].m_size;
              pvVar14[uVar11].m_size = *(uint *)(lVar4 + -4 + lVar10);
              *(uint *)(lVar4 + -4 + lVar10) = uVar2;
              uVar2 = pvVar14[uVar11].m_capacity;
              pvVar14[uVar11].m_capacity = *(uint *)(lVar4 + lVar10);
              *(uint *)(lVar4 + lVar10) = uVar2;
              uVar9 = uVar9 + 1;
              lVar10 = lVar10 + 0x10;
            } while (uVar9 < *(uint *)(local_128 + lVar12 + 8));
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    }
    do {
      pvVar15 = *(void **)&pvVar13[-2].m_size;
      if (pvVar15 != (void *)0x0) {
        uVar16 = *(uint *)&pvVar13[-1].m_p;
        if ((ulong)uVar16 != 0) {
          lVar8 = 0;
          do {
            if (*(void **)((long)pvVar15 + lVar8) != (void *)0x0) {
              crnlib_free(*(void **)((long)pvVar15 + lVar8));
            }
            lVar8 = lVar8 + 0x10;
          } while ((ulong)uVar16 << 4 != lVar8);
          pvVar15 = *(void **)&pvVar13[-2].m_size;
        }
        crnlib_free(pvVar15);
      }
      pvVar13 = (vector<unsigned_int> *)&pvVar13[-3].m_size;
    } while (pvVar13 != &local_138);
    lVar8 = 0x60;
    do {
      if (*(void **)(local_b0 + lVar8 + 8) != (void *)0x0) {
        crnlib_free(*(void **)(local_b0 + lVar8 + 8));
      }
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != 0);
    if (local_148.m_p != (uint *)0x0) {
      crnlib_free(local_148.m_p);
    }
    if (bVar1 != false) {
      return false;
    }
  }
  return (bool)(this->m_canceled ^ 1);
}

Assistant:

bool create_clusters(
            const weighted_vec_array& weighted_vecs,
            uint max_clusters, crnlib::vector<crnlib::vector<uint> >& cluster_indices,
            progress_callback_func pProgress_callback,
            void* pProgress_callback_data)
        {
            m_main_thread_id = crn_get_current_thread_id();
            m_canceled = false;
            m_pProgress_callback = pProgress_callback;
            m_pProgress_callback_data = pProgress_callback_data;

            if (max_clusters >= 128)
            {
                crnlib::vector<uint> primary_indices(weighted_vecs.size());
                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    primary_indices[i] = i;
                }

                CRNLIB_ASSUME(cMaxClusterizers == 4);

                crnlib::vector<uint> indices[6];

                compute_split(weighted_vecs, primary_indices, indices[0], indices[1]);
                compute_split(weighted_vecs, indices[0], indices[2], indices[3]);
                compute_split(weighted_vecs, indices[1], indices[4], indices[5]);

                create_clusters_task_state task_state[4];

                m_cluster_task_displayed_progress = false;

                uint total_partitions = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (num_indices)
                    {
                        total_partitions++;
                    }
                }

                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (!num_indices)
                    {
                        continue;
                    }

                    task_state[i].m_pWeighted_vecs = &weighted_vecs;
                    task_state[i].m_pIndices = &indices[2 + i];
                    task_state[i].m_max_clusters = (max_clusters + (total_partitions / 2)) / total_partitions;

                    m_pTask_pool->queue_object_task(this, &threaded_clusterizer::create_clusters_task, i, &task_state[i]);
                }

                m_pTask_pool->join();

                if (m_canceled)
                {
                    return false;
                }

                uint total_clusters = 0;
                for (uint i = 0; i < 4; i++)
                {
                    total_clusters += task_state[i].m_cluster_indices.size();
                }

                cluster_indices.reserve(total_clusters);
                cluster_indices.resize(0);

                for (uint i = 0; i < 4; i++)
                {
                    const uint ofs = cluster_indices.size();

                    cluster_indices.resize(ofs + task_state[i].m_cluster_indices.size());

                    for (uint j = 0; j < task_state[i].m_cluster_indices.size(); j++)
                    {
                        cluster_indices[ofs + j].swap(task_state[i].m_cluster_indices[j]);
                    }
                }
            }
            else
            {
                m_clusterizers[0].clear();
                m_clusterizers[0].get_training_vecs().reserve(weighted_vecs.size());

                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    const weighted_vec& v = weighted_vecs[i];

                    m_clusterizers[0].add_training_vec(v.m_vec, v.m_weight);
                }

                m_clusterizers[0].generate_codebook(max_clusters, generate_codebook_progress_callback, this, false);  //m_params.m_dxt_quality <= cCRNDXTQualityFast);

                const uint num_clusters = m_clusterizers[0].get_codebook_size();

                m_clusterizers[0].retrieve_clusters(num_clusters, cluster_indices);
            }

            return !m_canceled;
        }